

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderCreateInfoWrapper::ShaderCreateInfoWrapper
          (ShaderCreateInfoWrapper *this,ShaderCreateInfoWrapper *rhs)

{
  ShaderCreateInfo local_b0;
  ShaderCreateInfoWrapper *local_18;
  ShaderCreateInfoWrapper *rhs_local;
  ShaderCreateInfoWrapper *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  memcpy(this,rhs,0x98);
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::RefCntAutoPtr
            (&this->m_SourceFactory,&local_18->m_SourceFactory);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::unique_ptr
            (&this->m_pRawMemory,&local_18->m_pRawMemory);
  ShaderCreateInfo::ShaderCreateInfo(&local_b0);
  memcpy(local_18,&local_b0,0x98);
  return;
}

Assistant:

ShaderCreateInfoWrapper(ShaderCreateInfoWrapper&& rhs) noexcept :
        m_CreateInfo{rhs.m_CreateInfo},
        m_SourceFactory{std::move(rhs.m_SourceFactory)},
        m_pRawMemory{std::move(rhs.m_pRawMemory)}
    {
        rhs.m_CreateInfo = {};
    }